

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualOutput.cpp
# Opt level: O0

outputArrow * __thiscall
visualOutput::initArrow(visualOutput *this,int8_t nodeIndex,int8_t arrowIndex)

{
  arrowType *paVar1;
  int8_t iVar2;
  int iVar3;
  int iVar4;
  reference pvVar5;
  outputArrow *poVar6;
  double dVar7;
  __type _Var8;
  __type _Var9;
  int local_e8;
  int local_e4;
  value_type local_d8;
  undefined1 local_c9;
  string local_c8 [39];
  undefined1 local_a1;
  string local_a0 [39];
  undefined1 local_79;
  string local_78 [39];
  undefined1 local_51;
  string local_50 [52];
  int local_1c;
  int local_18;
  int x;
  int y;
  int8_t arrowIndex_local;
  int8_t nodeIndex_local;
  visualOutput *this_local;
  
  x._2_1_ = arrowIndex;
  x._3_1_ = nodeIndex;
  _y = this;
  pvVar5 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)nodeIndex);
  if (pvVar5->w_main == (WINDOW *)0x0) {
    local_e4 = -1;
  }
  else {
    pvVar5 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)x._3_1_);
    local_e4 = (int)pvVar5->w_main->_begy;
  }
  local_18 = local_e4;
  pvVar5 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)x._3_1_);
  if (pvVar5->w_main == (WINDOW *)0x0) {
    local_e8 = -1;
  }
  else {
    pvVar5 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)x._3_1_);
    local_e8 = (int)pvVar5->w_main->_begx;
  }
  local_1c = local_e8;
  if (x._2_1_ == '\0') {
    poVar6 = (outputArrow *)operator_new(0x20);
    iVar2 = x._3_1_;
    local_51 = 1;
    iVar3 = local_18 + -1;
    dVar7 = (double)local_1c;
    _Var8 = std::floor<int>(0xd);
    _Var9 = std::floor<int>(6);
    iVar4 = (int)x._2_1_;
    std::__cxx11::string::string(local_50,(string *)&(this->super_output).lbl);
    outputArrow::outputArrow
              (poVar6,iVar2,iVar3,(int)((dVar7 + _Var8) - _Var9),iVar4,(string *)local_50);
    local_51 = 0;
    (this->super_output).outArr = poVar6;
    std::__cxx11::string::~string(local_50);
  }
  else if (x._2_1_ == '\x01') {
    poVar6 = (outputArrow *)operator_new(0x20);
    iVar2 = x._3_1_;
    local_79 = 1;
    dVar7 = (double)local_18;
    _Var8 = std::floor<int>(5);
    _Var9 = std::floor<int>(2);
    iVar3 = local_1c + 0x1b;
    iVar4 = (int)x._2_1_;
    std::__cxx11::string::string(local_78,(string *)&(this->super_output).lbl);
    outputArrow::outputArrow
              (poVar6,iVar2,(int)((dVar7 + _Var8) - _Var9),iVar3,iVar4,(string *)local_78);
    local_79 = 0;
    (this->super_output).outArr = poVar6;
    std::__cxx11::string::~string(local_78);
  }
  else if (x._2_1_ == '\x02') {
    poVar6 = (outputArrow *)operator_new(0x20);
    iVar2 = x._3_1_;
    local_a1 = 1;
    iVar3 = local_18 + 0xb;
    dVar7 = (double)local_1c;
    _Var8 = std::floor<int>(0xd);
    _Var9 = std::floor<int>(6);
    iVar4 = (int)x._2_1_;
    std::__cxx11::string::string(local_a0,(string *)&(this->super_output).lbl);
    outputArrow::outputArrow
              (poVar6,iVar2,iVar3,(int)((dVar7 + _Var8) - _Var9),iVar4,(string *)local_a0);
    local_a1 = 0;
    (this->super_output).outArr = poVar6;
    std::__cxx11::string::~string(local_a0);
  }
  else {
    poVar6 = (outputArrow *)operator_new(0x20);
    iVar2 = x._3_1_;
    local_c9 = 1;
    dVar7 = (double)local_18;
    _Var8 = std::floor<int>(5);
    _Var9 = std::floor<int>(2);
    iVar3 = local_1c + -4;
    iVar4 = (int)x._2_1_;
    std::__cxx11::string::string(local_c8,(string *)&(this->super_output).lbl);
    outputArrow::outputArrow
              (poVar6,iVar2,(int)((dVar7 + _Var8) - _Var9),iVar3,iVar4,(string *)local_c8);
    local_c9 = 0;
    (this->super_output).outArr = poVar6;
    std::__cxx11::string::~string(local_c8);
  }
  local_d8 = &((this->super_output).outArr)->super_arrowType;
  std::vector<arrowType_*,_std::allocator<arrowType_*>_>::push_back(&gridArrows,&local_d8);
  paVar1 = &((this->super_output).outArr)->super_arrowType;
  pvVar5 = std::vector<node,_std::allocator<node>_>::operator[](&grid,(long)x._3_1_);
  pvVar5->arrows[x._2_1_] = paVar1;
  wrefresh((((this->super_output).outArr)->super_arrowType).win);
  return (this->super_output).outArr;
}

Assistant:

outputArrow *visualOutput::initArrow(int8_t nodeIndex, int8_t arrowIndex) {
	int y, x;
	getbegyx(grid[nodeIndex].w_main, y, x);

	if (arrowIndex == 0)
		outArr = new outputArrow(nodeIndex, y - ARROW_V_HEIGHT, x + floor(NODE_WIDTH / 2) - floor(ARROW_V_WIDTH / 2), arrowIndex, lbl);
	else if (arrowIndex == 1)
		outArr = new outputArrow(nodeIndex, y + floor(NODE_HEIGHT / 2) - floor(ARROW_H_HEIGHT / 2), x + NODE_WIDTH + GAP_WIDTH_H, arrowIndex, lbl);
	else if (arrowIndex == 2)
		outArr = new outputArrow(nodeIndex, y + NODE_HEIGHT + GAP_WIDTH_V, x + floor(NODE_WIDTH / 2) - floor(ARROW_V_WIDTH / 2), arrowIndex, lbl);
	else
		outArr = new outputArrow(nodeIndex, y + floor(NODE_HEIGHT / 2) - floor(ARROW_H_HEIGHT / 2), x - ARROW_H_WIDTH, arrowIndex, lbl);

	gridArrows.push_back(outArr);
	grid[nodeIndex].arrows[arrowIndex] = outArr;

	wrefresh(outArr->win);

	return outArr;
}